

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

iterator __thiscall
fmt::v5::internal::arg_formatter_base<fmt::v5::output_range<char_*,_char>_>::operator()
          (arg_formatter_base<fmt::v5::output_range<char_*,_char>_> *this,
          basic_string_view<char> value)

{
  char cVar1;
  iterator __dest;
  ulong uVar2;
  ulong __n;
  char **it;
  format_specs *spec;
  iterator pcVar3;
  ptrdiff_t _Num;
  char *data;
  str_writer<char> local_30;
  
  __n = value.size_;
  local_30.s = value.data_;
  spec = this->specs_;
  if (spec == (format_specs *)0x0) {
    __dest = (this->writer_).out_;
    if (__n != 0) {
      memmove(__dest,local_30.s,__n);
    }
    pcVar3 = __dest + __n;
    (this->writer_).out_ = pcVar3;
  }
  else {
    cVar1 = (spec->super_core_format_specs).type;
    if ((cVar1 != '\0') && (cVar1 != 's')) {
      error_handler::on_error((error_handler *)&local_30,"invalid type specifier");
      spec = this->specs_;
    }
    uVar2 = (ulong)(spec->super_core_format_specs).precision;
    local_30.size_ = __n;
    if (uVar2 < __n) {
      local_30.size_ = uVar2;
    }
    if ((long)uVar2 < 0) {
      local_30.size_ = __n;
    }
    basic_writer<fmt::v5::output_range<char*,char>>::
    write_padded<fmt::v5::basic_writer<fmt::v5::output_range<char*,char>>::str_writer<char>>
              ((basic_writer<fmt::v5::output_range<char*,char>> *)this,&spec->super_align_spec,
               &local_30);
    pcVar3 = (this->writer_).out_;
  }
  return pcVar3;
}

Assistant:

iterator operator()(basic_string_view<char_type> value) {
    if (specs_) {
      internal::check_string_type_spec(
            specs_->type, internal::error_handler());
      writer_.write(value, *specs_);
    } else {
      writer_.write(value);
    }
    return out();
  }